

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall LogFile::flush(LogFile *this)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)
            (this->mutex_)._M_t.super___uniq_ptr_impl<MutexLock,_std::default_delete<MutexLock>_>.
            _M_t.super__Tuple_impl<0UL,_MutexLock_*,_std::default_delete<MutexLock>_>.
            super__Head_base<0UL,_MutexLock_*,_false>._M_head_impl;
  pthread_mutex_lock(__mutex);
  AppendFile::flush((this->file_)._M_t.
                    super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
                    super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
                    super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void LogFile::flush(){
    MutexLockGuard lock(*mutex_);
    file_->flush();
}